

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pgraph_class_d3d56.cc
# Opt level: O0

vector<hwtest::pgraph::SingleMthdTest_*,_std::allocator<hwtest::pgraph::SingleMthdTest_*>_> *
__thiscall
hwtest::pgraph::D3D5::mthds
          (vector<hwtest::pgraph::SingleMthdTest_*,_std::allocator<hwtest::pgraph::SingleMthdTest_*>_>
           *__return_storage_ptr__,D3D5 *this)

{
  initializer_list<hwtest::pgraph::SingleMthdTest_*> __l;
  SingleMthdTest *this_00;
  result_type rVar1;
  MthdNotify *this_01;
  MthdDmaNotify *this_02;
  MthdDmaGrobj *pMVar2;
  MthdCtxSurf3D *this_03;
  MthdD3D56TexColorKey *this_04;
  MthdD3D56TexOffset *this_05;
  MthdD3D56TexFormat *this_06;
  MthdD3D56TexFilter *this_07;
  MthdD3D56Blend *this_08;
  MthdD3D56Config *this_09;
  MthdD3D56FogColor *this_10;
  MthdD3D56TlvX *this_11;
  MthdD3D56TlvY *this_12;
  MthdD3D56TlvZ *this_13;
  MthdD3D56TlvRhw *this_14;
  MthdD3D56TlvColor *this_15;
  MthdD3D56TlvFogCol1 *this_16;
  MthdD3D56TlvUv *pMVar3;
  UntestedMthd *this_17;
  allocator<hwtest::pgraph::SingleMthdTest_*> local_453;
  undefined1 local_452;
  allocator local_451;
  string local_450 [38];
  undefined1 local_42a;
  allocator local_429;
  string local_428 [38];
  undefined1 local_402;
  allocator local_401;
  string local_400 [38];
  undefined1 local_3da;
  allocator local_3d9;
  string local_3d8 [38];
  undefined1 local_3b2;
  allocator local_3b1;
  string local_3b0 [38];
  undefined1 local_38a;
  allocator local_389;
  string local_388 [38];
  undefined1 local_362;
  allocator local_361;
  string local_360 [38];
  undefined1 local_33a;
  allocator local_339;
  string local_338 [38];
  undefined1 local_312;
  allocator local_311;
  string local_310 [38];
  undefined1 local_2ea;
  allocator local_2e9;
  string local_2e8 [38];
  undefined1 local_2c2;
  allocator local_2c1;
  string local_2c0 [38];
  undefined1 local_29a;
  allocator local_299;
  string local_298 [38];
  undefined1 local_272;
  allocator local_271;
  string local_270 [38];
  undefined1 local_24a;
  allocator local_249;
  string local_248 [38];
  undefined1 local_222;
  allocator local_221;
  string local_220 [38];
  undefined1 local_1fa;
  allocator local_1f9;
  string local_1f8 [38];
  undefined1 local_1d2;
  allocator local_1d1;
  string local_1d0 [38];
  undefined1 local_1aa;
  allocator local_1a9;
  string local_1a8 [38];
  undefined1 local_182;
  allocator local_181;
  string local_180 [38];
  undefined1 local_15a;
  allocator local_159;
  string local_158 [38];
  undefined1 local_132;
  allocator local_131;
  string local_130 [38];
  undefined1 local_10a;
  allocator local_109;
  string local_108 [48];
  SingleMthdTest *local_d8;
  MthdNotify *local_d0;
  MthdDmaNotify *local_c8;
  MthdDmaGrobj *local_c0;
  MthdDmaGrobj *local_b8;
  MthdCtxSurf3D *local_b0;
  MthdD3D56TexColorKey *local_a8;
  MthdD3D56TexOffset *local_a0;
  MthdD3D56TexFormat *local_98;
  MthdD3D56TexFilter *local_90;
  MthdD3D56Blend *local_88;
  MthdD3D56Config *local_80;
  MthdD3D56FogColor *local_78;
  MthdD3D56TlvX *local_70;
  MthdD3D56TlvY *local_68;
  MthdD3D56TlvZ *local_60;
  MthdD3D56TlvRhw *local_58;
  MthdD3D56TlvColor *local_50;
  MthdD3D56TlvFogCol1 *local_48;
  MthdD3D56TlvUv *local_40;
  MthdD3D56TlvUv *local_38;
  UntestedMthd *local_30;
  iterator local_28;
  size_type local_20;
  D3D5 *local_18;
  D3D5 *this_local;
  
  local_18 = this;
  this_local = (D3D5 *)__return_storage_ptr__;
  this_00 = (SingleMthdTest *)operator_new(0x25950);
  local_10a = 1;
  rVar1 = std::
          mersenne_twister_engine<unsigned_long,_32UL,_624UL,_397UL,_31UL,_2567483615UL,_11UL,_4294967295UL,_7UL,_2636928640UL,_15UL,_4022730752UL,_18UL,_1812433253UL>
          ::operator()(&(this->super_Class).rnd);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_108,"nop",&local_109);
  MthdNop::SingleMthdTest
            ((MthdNop *)this_00,&(this->super_Class).opt,(uint32_t)rVar1,(string *)local_108,-1,
             (this->super_Class).cls,0x100,1,4);
  local_10a = 0;
  local_d8 = this_00;
  this_01 = (MthdNotify *)operator_new(0x25950);
  local_132 = 1;
  rVar1 = std::
          mersenne_twister_engine<unsigned_long,_32UL,_624UL,_397UL,_31UL,_2567483615UL,_11UL,_4294967295UL,_7UL,_2636928640UL,_15UL,_4022730752UL,_18UL,_1812433253UL>
          ::operator()(&(this->super_Class).rnd);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_130,"notify",&local_131);
  MthdNotify::SingleMthdTest
            (this_01,&(this->super_Class).opt,(uint32_t)rVar1,(string *)local_130,-1,
             (this->super_Class).cls,0x104,1,4);
  local_132 = 0;
  local_d0 = this_01;
  this_02 = (MthdDmaNotify *)operator_new(0x25950);
  local_15a = 1;
  rVar1 = std::
          mersenne_twister_engine<unsigned_long,_32UL,_624UL,_397UL,_31UL,_2567483615UL,_11UL,_4294967295UL,_7UL,_2636928640UL,_15UL,_4022730752UL,_18UL,_1812433253UL>
          ::operator()(&(this->super_Class).rnd);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_158,"dma_notify",&local_159);
  MthdDmaNotify::SingleMthdTest
            (this_02,&(this->super_Class).opt,(uint32_t)rVar1,(string *)local_158,-1,
             (this->super_Class).cls,0x180,1,4);
  local_15a = 0;
  local_c8 = this_02;
  pMVar2 = (MthdDmaGrobj *)operator_new(0x25960);
  local_182 = 1;
  rVar1 = std::
          mersenne_twister_engine<unsigned_long,_32UL,_624UL,_397UL,_31UL,_2567483615UL,_11UL,_4294967295UL,_7UL,_2636928640UL,_15UL,_4022730752UL,_18UL,_1812433253UL>
          ::operator()(&(this->super_Class).rnd);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_180,"dma_tex_a",&local_181);
  MthdDmaGrobj::MthdDmaGrobj
            (pMVar2,&(this->super_Class).opt,(uint32_t)rVar1,(string *)local_180,-1,
             (this->super_Class).cls,0x184,0,4);
  local_182 = 0;
  local_c0 = pMVar2;
  pMVar2 = (MthdDmaGrobj *)operator_new(0x25960);
  local_1aa = 1;
  rVar1 = std::
          mersenne_twister_engine<unsigned_long,_32UL,_624UL,_397UL,_31UL,_2567483615UL,_11UL,_4294967295UL,_7UL,_2636928640UL,_15UL,_4022730752UL,_18UL,_1812433253UL>
          ::operator()(&(this->super_Class).rnd);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_1a8,"dma_tex_b",&local_1a9);
  MthdDmaGrobj::MthdDmaGrobj
            (pMVar2,&(this->super_Class).opt,(uint32_t)rVar1,(string *)local_1a8,-1,
             (this->super_Class).cls,0x188,1,4);
  local_1aa = 0;
  local_b8 = pMVar2;
  this_03 = (MthdCtxSurf3D *)operator_new(0x25958);
  local_1d2 = 1;
  rVar1 = std::
          mersenne_twister_engine<unsigned_long,_32UL,_624UL,_397UL,_31UL,_2567483615UL,_11UL,_4294967295UL,_7UL,_2636928640UL,_15UL,_4022730752UL,_18UL,_1812433253UL>
          ::operator()(&(this->super_Class).rnd);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_1d0,"ctx_surf3d",&local_1d1);
  MthdCtxSurf3D::MthdCtxSurf3D
            (this_03,&(this->super_Class).opt,(uint32_t)rVar1,(string *)local_1d0,-1,
             (this->super_Class).cls,0x18c,0);
  local_1d2 = 0;
  local_b0 = this_03;
  this_04 = (MthdD3D56TexColorKey *)operator_new(0x25950);
  local_1fa = 1;
  rVar1 = std::
          mersenne_twister_engine<unsigned_long,_32UL,_624UL,_397UL,_31UL,_2567483615UL,_11UL,_4294967295UL,_7UL,_2636928640UL,_15UL,_4022730752UL,_18UL,_1812433253UL>
          ::operator()(&(this->super_Class).rnd);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_1f8,"tex_color_key",&local_1f9);
  MthdD3D56TexColorKey::SingleMthdTest
            (this_04,&(this->super_Class).opt,(uint32_t)rVar1,(string *)local_1f8,-1,
             (this->super_Class).cls,0x300,1,4);
  local_1fa = 0;
  local_a8 = this_04;
  this_05 = (MthdD3D56TexOffset *)operator_new(0x25958);
  local_222 = 1;
  rVar1 = std::
          mersenne_twister_engine<unsigned_long,_32UL,_624UL,_397UL,_31UL,_2567483615UL,_11UL,_4294967295UL,_7UL,_2636928640UL,_15UL,_4022730752UL,_18UL,_1812433253UL>
          ::operator()(&(this->super_Class).rnd);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_220,"tex_offset",&local_221);
  MthdD3D56TexOffset::MthdD3D56TexOffset
            (this_05,&(this->super_Class).opt,(uint32_t)rVar1,(string *)local_220,-1,
             (this->super_Class).cls,0x304,3);
  local_222 = 0;
  local_a0 = this_05;
  this_06 = (MthdD3D56TexFormat *)operator_new(0x25958);
  local_24a = 1;
  rVar1 = std::
          mersenne_twister_engine<unsigned_long,_32UL,_624UL,_397UL,_31UL,_2567483615UL,_11UL,_4294967295UL,_7UL,_2636928640UL,_15UL,_4022730752UL,_18UL,_1812433253UL>
          ::operator()(&(this->super_Class).rnd);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_248,"tex_format",&local_249);
  MthdD3D56TexFormat::MthdD3D56TexFormat
            (this_06,&(this->super_Class).opt,(uint32_t)rVar1,(string *)local_248,-1,
             (this->super_Class).cls,0x308,3);
  local_24a = 0;
  local_98 = this_06;
  this_07 = (MthdD3D56TexFilter *)operator_new(0x25958);
  local_272 = 1;
  rVar1 = std::
          mersenne_twister_engine<unsigned_long,_32UL,_624UL,_397UL,_31UL,_2567483615UL,_11UL,_4294967295UL,_7UL,_2636928640UL,_15UL,_4022730752UL,_18UL,_1812433253UL>
          ::operator()(&(this->super_Class).rnd);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_270,"tex_filter",&local_271);
  MthdD3D56TexFilter::MthdD3D56TexFilter
            (this_07,&(this->super_Class).opt,(uint32_t)rVar1,(string *)local_270,-1,
             (this->super_Class).cls,0x30c,3);
  local_272 = 0;
  local_90 = this_07;
  this_08 = (MthdD3D56Blend *)operator_new(0x25950);
  local_29a = 1;
  rVar1 = std::
          mersenne_twister_engine<unsigned_long,_32UL,_624UL,_397UL,_31UL,_2567483615UL,_11UL,_4294967295UL,_7UL,_2636928640UL,_15UL,_4022730752UL,_18UL,_1812433253UL>
          ::operator()(&(this->super_Class).rnd);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_298,"blend",&local_299);
  MthdD3D56Blend::SingleMthdTest
            (this_08,&(this->super_Class).opt,(uint32_t)rVar1,(string *)local_298,-1,
             (this->super_Class).cls,0x310,1,4);
  local_29a = 0;
  local_88 = this_08;
  this_09 = (MthdD3D56Config *)operator_new(0x25950);
  local_2c2 = 1;
  rVar1 = std::
          mersenne_twister_engine<unsigned_long,_32UL,_624UL,_397UL,_31UL,_2567483615UL,_11UL,_4294967295UL,_7UL,_2636928640UL,_15UL,_4022730752UL,_18UL,_1812433253UL>
          ::operator()(&(this->super_Class).rnd);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_2c0,"config",&local_2c1);
  MthdD3D56Config::SingleMthdTest
            (this_09,&(this->super_Class).opt,(uint32_t)rVar1,(string *)local_2c0,-1,
             (this->super_Class).cls,0x314,1,4);
  local_2c2 = 0;
  local_80 = this_09;
  this_10 = (MthdD3D56FogColor *)operator_new(0x25950);
  local_2ea = 1;
  rVar1 = std::
          mersenne_twister_engine<unsigned_long,_32UL,_624UL,_397UL,_31UL,_2567483615UL,_11UL,_4294967295UL,_7UL,_2636928640UL,_15UL,_4022730752UL,_18UL,_1812433253UL>
          ::operator()(&(this->super_Class).rnd);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_2e8,"fog_color",&local_2e9);
  MthdD3D56FogColor::SingleMthdTest
            (this_10,&(this->super_Class).opt,(uint32_t)rVar1,(string *)local_2e8,-1,
             (this->super_Class).cls,0x318,1,4);
  local_2ea = 0;
  local_78 = this_10;
  this_11 = (MthdD3D56TlvX *)operator_new(0x25950);
  local_312 = 1;
  rVar1 = std::
          mersenne_twister_engine<unsigned_long,_32UL,_624UL,_397UL,_31UL,_2567483615UL,_11UL,_4294967295UL,_7UL,_2636928640UL,_15UL,_4022730752UL,_18UL,_1812433253UL>
          ::operator()(&(this->super_Class).rnd);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_310,"tlv_x",&local_311);
  MthdD3D56TlvX::SingleMthdTest
            (this_11,&(this->super_Class).opt,(uint32_t)rVar1,(string *)local_310,-1,
             (this->super_Class).cls,0x400,0x10,0x20);
  local_312 = 0;
  local_70 = this_11;
  this_12 = (MthdD3D56TlvY *)operator_new(0x25950);
  local_33a = 1;
  rVar1 = std::
          mersenne_twister_engine<unsigned_long,_32UL,_624UL,_397UL,_31UL,_2567483615UL,_11UL,_4294967295UL,_7UL,_2636928640UL,_15UL,_4022730752UL,_18UL,_1812433253UL>
          ::operator()(&(this->super_Class).rnd);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_338,"tlv_y",&local_339);
  MthdD3D56TlvY::SingleMthdTest
            (this_12,&(this->super_Class).opt,(uint32_t)rVar1,(string *)local_338,-1,
             (this->super_Class).cls,0x404,0x10,0x20);
  local_33a = 0;
  local_68 = this_12;
  this_13 = (MthdD3D56TlvZ *)operator_new(0x25950);
  local_362 = 1;
  rVar1 = std::
          mersenne_twister_engine<unsigned_long,_32UL,_624UL,_397UL,_31UL,_2567483615UL,_11UL,_4294967295UL,_7UL,_2636928640UL,_15UL,_4022730752UL,_18UL,_1812433253UL>
          ::operator()(&(this->super_Class).rnd);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_360,"tlv_z",&local_361);
  MthdD3D56TlvZ::SingleMthdTest
            (this_13,&(this->super_Class).opt,(uint32_t)rVar1,(string *)local_360,-1,
             (this->super_Class).cls,0x408,0x10,0x20);
  local_362 = 0;
  local_60 = this_13;
  this_14 = (MthdD3D56TlvRhw *)operator_new(0x25950);
  local_38a = 1;
  rVar1 = std::
          mersenne_twister_engine<unsigned_long,_32UL,_624UL,_397UL,_31UL,_2567483615UL,_11UL,_4294967295UL,_7UL,_2636928640UL,_15UL,_4022730752UL,_18UL,_1812433253UL>
          ::operator()(&(this->super_Class).rnd);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_388,"tlv_rhw",&local_389);
  MthdD3D56TlvRhw::SingleMthdTest
            (this_14,&(this->super_Class).opt,(uint32_t)rVar1,(string *)local_388,-1,
             (this->super_Class).cls,0x40c,0x10,0x20);
  local_38a = 0;
  local_58 = this_14;
  this_15 = (MthdD3D56TlvColor *)operator_new(0x25950);
  local_3b2 = 1;
  rVar1 = std::
          mersenne_twister_engine<unsigned_long,_32UL,_624UL,_397UL,_31UL,_2567483615UL,_11UL,_4294967295UL,_7UL,_2636928640UL,_15UL,_4022730752UL,_18UL,_1812433253UL>
          ::operator()(&(this->super_Class).rnd);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_3b0,"tlv_color",&local_3b1);
  MthdD3D56TlvColor::SingleMthdTest
            (this_15,&(this->super_Class).opt,(uint32_t)rVar1,(string *)local_3b0,-1,
             (this->super_Class).cls,0x410,0x10,0x20);
  local_3b2 = 0;
  local_50 = this_15;
  this_16 = (MthdD3D56TlvFogCol1 *)operator_new(0x25950);
  local_3da = 1;
  rVar1 = std::
          mersenne_twister_engine<unsigned_long,_32UL,_624UL,_397UL,_31UL,_2567483615UL,_11UL,_4294967295UL,_7UL,_2636928640UL,_15UL,_4022730752UL,_18UL,_1812433253UL>
          ::operator()(&(this->super_Class).rnd);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_3d8,"tlv_fog_col1",&local_3d9);
  MthdD3D56TlvFogCol1::SingleMthdTest
            (this_16,&(this->super_Class).opt,(uint32_t)rVar1,(string *)local_3d8,-1,
             (this->super_Class).cls,0x414,0x10,0x20);
  local_3da = 0;
  local_48 = this_16;
  pMVar3 = (MthdD3D56TlvUv *)operator_new(0x25960);
  local_402 = 1;
  rVar1 = std::
          mersenne_twister_engine<unsigned_long,_32UL,_624UL,_397UL,_31UL,_2567483615UL,_11UL,_4294967295UL,_7UL,_2636928640UL,_15UL,_4022730752UL,_18UL,_1812433253UL>
          ::operator()(&(this->super_Class).rnd);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_400,"tlv_u",&local_401);
  MthdD3D56TlvUv::MthdD3D56TlvUv
            (pMVar3,&(this->super_Class).opt,(uint32_t)rVar1,(string *)local_400,-1,
             (this->super_Class).cls,0x418,0x10,0x20,0,0,false);
  local_402 = 0;
  local_40 = pMVar3;
  pMVar3 = (MthdD3D56TlvUv *)operator_new(0x25960);
  local_42a = 1;
  rVar1 = std::
          mersenne_twister_engine<unsigned_long,_32UL,_624UL,_397UL,_31UL,_2567483615UL,_11UL,_4294967295UL,_7UL,_2636928640UL,_15UL,_4022730752UL,_18UL,_1812433253UL>
          ::operator()(&(this->super_Class).rnd);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_428,"tlv_v",&local_429);
  MthdD3D56TlvUv::MthdD3D56TlvUv
            (pMVar3,&(this->super_Class).opt,(uint32_t)rVar1,(string *)local_428,-1,
             (this->super_Class).cls,0x41c,0x10,0x20,0,1,true);
  local_42a = 0;
  local_38 = pMVar3;
  this_17 = (UntestedMthd *)operator_new(0x25950);
  local_452 = 1;
  rVar1 = std::
          mersenne_twister_engine<unsigned_long,_32UL,_624UL,_397UL,_31UL,_2567483615UL,_11UL,_4294967295UL,_7UL,_2636928640UL,_15UL,_4022730752UL,_18UL,_1812433253UL>
          ::operator()(&(this->super_Class).rnd);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_450,"draw",&local_451);
  UntestedMthd::SingleMthdTest
            (this_17,&(this->super_Class).opt,(uint32_t)rVar1,(string *)local_450,-1,
             (this->super_Class).cls,0x600,0x40,4);
  local_452 = 0;
  local_28 = &local_d8;
  local_20 = 0x16;
  local_30 = this_17;
  std::allocator<hwtest::pgraph::SingleMthdTest_*>::allocator(&local_453);
  __l._M_len = local_20;
  __l._M_array = local_28;
  std::vector<hwtest::pgraph::SingleMthdTest_*,_std::allocator<hwtest::pgraph::SingleMthdTest_*>_>::
  vector(__return_storage_ptr__,__l,&local_453);
  std::allocator<hwtest::pgraph::SingleMthdTest_*>::~allocator(&local_453);
  std::__cxx11::string::~string(local_450);
  std::allocator<char>::~allocator((allocator<char> *)&local_451);
  std::__cxx11::string::~string(local_428);
  std::allocator<char>::~allocator((allocator<char> *)&local_429);
  std::__cxx11::string::~string(local_400);
  std::allocator<char>::~allocator((allocator<char> *)&local_401);
  std::__cxx11::string::~string(local_3d8);
  std::allocator<char>::~allocator((allocator<char> *)&local_3d9);
  std::__cxx11::string::~string(local_3b0);
  std::allocator<char>::~allocator((allocator<char> *)&local_3b1);
  std::__cxx11::string::~string(local_388);
  std::allocator<char>::~allocator((allocator<char> *)&local_389);
  std::__cxx11::string::~string(local_360);
  std::allocator<char>::~allocator((allocator<char> *)&local_361);
  std::__cxx11::string::~string(local_338);
  std::allocator<char>::~allocator((allocator<char> *)&local_339);
  std::__cxx11::string::~string(local_310);
  std::allocator<char>::~allocator((allocator<char> *)&local_311);
  std::__cxx11::string::~string(local_2e8);
  std::allocator<char>::~allocator((allocator<char> *)&local_2e9);
  std::__cxx11::string::~string(local_2c0);
  std::allocator<char>::~allocator((allocator<char> *)&local_2c1);
  std::__cxx11::string::~string(local_298);
  std::allocator<char>::~allocator((allocator<char> *)&local_299);
  std::__cxx11::string::~string(local_270);
  std::allocator<char>::~allocator((allocator<char> *)&local_271);
  std::__cxx11::string::~string(local_248);
  std::allocator<char>::~allocator((allocator<char> *)&local_249);
  std::__cxx11::string::~string(local_220);
  std::allocator<char>::~allocator((allocator<char> *)&local_221);
  std::__cxx11::string::~string(local_1f8);
  std::allocator<char>::~allocator((allocator<char> *)&local_1f9);
  std::__cxx11::string::~string(local_1d0);
  std::allocator<char>::~allocator((allocator<char> *)&local_1d1);
  std::__cxx11::string::~string(local_1a8);
  std::allocator<char>::~allocator((allocator<char> *)&local_1a9);
  std::__cxx11::string::~string(local_180);
  std::allocator<char>::~allocator((allocator<char> *)&local_181);
  std::__cxx11::string::~string(local_158);
  std::allocator<char>::~allocator((allocator<char> *)&local_159);
  std::__cxx11::string::~string(local_130);
  std::allocator<char>::~allocator((allocator<char> *)&local_131);
  std::__cxx11::string::~string(local_108);
  std::allocator<char>::~allocator((allocator<char> *)&local_109);
  return __return_storage_ptr__;
}

Assistant:

std::vector<SingleMthdTest *> D3D5::mthds() {
	return {
		new MthdNop(opt, rnd(), "nop", -1, cls, 0x100),
		new MthdNotify(opt, rnd(), "notify", -1, cls, 0x104),
		new MthdDmaNotify(opt, rnd(), "dma_notify", -1, cls, 0x180),
		new MthdDmaGrobj(opt, rnd(), "dma_tex_a", -1, cls, 0x184, 0, DMA_R | DMA_ALIGN),
		new MthdDmaGrobj(opt, rnd(), "dma_tex_b", -1, cls, 0x188, 1, DMA_R | DMA_ALIGN),
		new MthdCtxSurf3D(opt, rnd(), "ctx_surf3d", -1, cls, 0x18c, SURF2D_NV4),
		new MthdD3D56TexColorKey(opt, rnd(), "tex_color_key", -1, cls, 0x300),
		new MthdD3D56TexOffset(opt, rnd(), "tex_offset", -1, cls, 0x304, 3),
		new MthdD3D56TexFormat(opt, rnd(), "tex_format", -1, cls, 0x308, 3),
		new MthdD3D56TexFilter(opt, rnd(), "tex_filter", -1, cls, 0x30c, 3),
		new MthdD3D56Blend(opt, rnd(), "blend", -1, cls, 0x310),
		new MthdD3D56Config(opt, rnd(), "config", -1, cls, 0x314),
		new MthdD3D56FogColor(opt, rnd(), "fog_color", -1, cls, 0x318),
		new MthdD3D56TlvX(opt, rnd(), "tlv_x", -1, cls, 0x400, 0x10, 0x20),
		new MthdD3D56TlvY(opt, rnd(), "tlv_y", -1, cls, 0x404, 0x10, 0x20),
		new MthdD3D56TlvZ(opt, rnd(), "tlv_z", -1, cls, 0x408, 0x10, 0x20),
		new MthdD3D56TlvRhw(opt, rnd(), "tlv_rhw", -1, cls, 0x40c, 0x10, 0x20),
		new MthdD3D56TlvColor(opt, rnd(), "tlv_color", -1, cls, 0x410, 0x10, 0x20),
		new MthdD3D56TlvFogCol1(opt, rnd(), "tlv_fog_col1", -1, cls, 0x414, 0x10, 0x20),
		new MthdD3D56TlvUv(opt, rnd(), "tlv_u", -1, cls, 0x418, 0x10, 0x20, 0, 0, false),
		new MthdD3D56TlvUv(opt, rnd(), "tlv_v", -1, cls, 0x41c, 0x10, 0x20, 0, 1, true),
		new UntestedMthd(opt, rnd(), "draw", -1, cls, 0x600, 0x40),
	};
}